

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.h
# Opt level: O0

int __thiscall
CVmHashEntryDict::del_entry
          (CVmHashEntryDict *this,CVmHashTable *table,vm_obj_id_t obj,vm_prop_id_t prop)

{
  int *piVar1;
  short in_CX;
  int in_EDX;
  CVmHashTable *in_RSI;
  long *in_RDI;
  int found;
  vm_dict_entry *prv;
  vm_dict_entry *nxt;
  vm_dict_entry *cur;
  int local_34;
  int *local_30;
  int *local_20;
  
  local_34 = 0;
  local_30 = (int *)0x0;
  local_20 = (int *)in_RDI[5];
  while (local_20 != (int *)0x0) {
    piVar1 = *(int **)(local_20 + 2);
    if ((*local_20 == in_EDX) && ((short)local_20[1] == in_CX)) {
      if (local_30 == (int *)0x0) {
        in_RDI[5] = (long)piVar1;
      }
      else {
        *(int **)(local_30 + 2) = piVar1;
      }
      if (local_20 != (int *)0x0) {
        operator_delete(local_20,0x18);
      }
      local_34 = 1;
    }
    local_30 = local_20;
    local_20 = piVar1;
  }
  if ((in_RDI[5] == 0) && (CVmHashTable::remove(in_RSI,(char *)in_RDI), in_RDI != (long *)0x0)) {
    (**(code **)(*in_RDI + 8))();
  }
  return local_34;
}

Assistant:

int del_entry(CVmHashTable *table, vm_obj_id_t obj, vm_prop_id_t prop)
    {
        vm_dict_entry *cur;
        vm_dict_entry *nxt;
        vm_dict_entry *prv;
        int found;

        /* find the entry in our list */
        for (found = FALSE, prv = 0, cur = list_ ; cur != 0 ;
             prv = cur, cur = nxt)
        {
            /* remember the next entry */
            nxt = cur->nxt_;

            /* if this is our entry, delete it */
            if (cur->obj_ == obj && cur->prop_ == prop)
            {
                /* unlink this entry */
                if (prv != 0)
                    prv->nxt_ = nxt;
                else
                    list_ = nxt;

                /* delete this entry */
                delete cur;

                /* note that we found at least one entry to delete */
                found = TRUE;
            }
        }

        /* if our list is now empty, delete myself from the table */
        if (list_ == 0)
        {
            /* remove myself from the table */
            table->remove(this);

            /* delete myself */
            delete this;
        }

        /* tell the caller whether we found anything to delete */
        return found;
    }